

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O0

ScriptPtr __thiscall
Jinx::Impl::Runtime::CreateScript(Runtime *this,BufferPtr *bytecode,Any *userContext)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ScriptPtr SVar1;
  any local_60;
  enable_shared_from_this<Jinx::Impl::Runtime> local_50;
  Allocator<Jinx::Impl::Script> local_39;
  shared_ptr<Jinx::Impl::Script> local_38;
  Any *userContext_local;
  BufferPtr *bytecode_local;
  Runtime *this_local;
  
  userContext_local = userContext;
  bytecode_local = bytecode;
  this_local = this;
  Allocator<Jinx::Impl::Script>::Allocator(&local_39);
  std::enable_shared_from_this<Jinx::Impl::Runtime>::shared_from_this(&local_50);
  std::static_pointer_cast<Jinx::Buffer,Jinx::Buffer>((shared_ptr<Jinx::Buffer> *)&local_60);
  std::
  allocate_shared<Jinx::Impl::Script,Jinx::Allocator<Jinx::Impl::Script>,std::shared_ptr<Jinx::Impl::Runtime>,std::shared_ptr<Jinx::Buffer>,std::any&>
            ((Allocator<Jinx::Impl::Script> *)&local_38,(shared_ptr<Jinx::Impl::Runtime> *)&local_39
             ,(shared_ptr<Jinx::Buffer> *)&local_50,&local_60);
  std::shared_ptr<Jinx::IScript>::shared_ptr<Jinx::Impl::Script,void>
            ((shared_ptr<Jinx::IScript> *)this,&local_38);
  std::shared_ptr<Jinx::Impl::Script>::~shared_ptr(&local_38);
  std::shared_ptr<Jinx::Buffer>::~shared_ptr((shared_ptr<Jinx::Buffer> *)&local_60);
  std::shared_ptr<Jinx::Impl::Runtime>::~shared_ptr((shared_ptr<Jinx::Impl::Runtime> *)&local_50);
  SVar1.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar1.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ScriptPtr)SVar1.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline_t ScriptPtr Runtime::CreateScript(BufferPtr bytecode, Any userContext)
	{
		return std::allocate_shared<Script>(Allocator<Script>(), shared_from_this(), std::static_pointer_cast<Buffer>(bytecode), userContext);
	}